

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compile.cc
# Opt level: O0

void __thiscall re2::Compiler::AddSuffix(Compiler *this,int id)

{
  uint32 uVar1;
  int alt;
  int id_local;
  Compiler *this_local;
  
  if ((this->failed_ & 1U) == 0) {
    if ((this->rune_range_).begin == 0) {
      (this->rune_range_).begin = id;
    }
    else if (this->encoding_ == kEncodingUTF8) {
      uVar1 = AddSuffixRecursive(this,(this->rune_range_).begin,id);
      (this->rune_range_).begin = uVar1;
    }
    else {
      uVar1 = AllocInst(this,1);
      if ((int)uVar1 < 0) {
        (this->rune_range_).begin = 0;
      }
      else {
        Prog::Inst::InitAlt(this->inst_ + (int)uVar1,(this->rune_range_).begin,id);
        (this->rune_range_).begin = uVar1;
      }
    }
  }
  return;
}

Assistant:

void Compiler::AddSuffix(int id) {
  if (failed_)
    return;

  if (rune_range_.begin == 0) {
    rune_range_.begin = id;
    return;
  }

  if (encoding_ == kEncodingUTF8) {
    // Build a trie in order to reduce fanout.
    rune_range_.begin = AddSuffixRecursive(rune_range_.begin, id);
    return;
  }

  int alt = AllocInst(1);
  if (alt < 0) {
    rune_range_.begin = 0;
    return;
  }
  inst_[alt].InitAlt(rune_range_.begin, id);
  rune_range_.begin = alt;
}